

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.h
# Opt level: O2

int __thiscall leveldb::Slice::compare(Slice *this,Slice *b)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong __n;
  uint uVar4;
  bool bVar5;
  
  uVar1 = this->size_;
  uVar2 = b->size_;
  bVar5 = uVar1 < uVar2;
  __n = uVar2;
  if (bVar5) {
    __n = uVar1;
  }
  uVar4 = 0xffffffff;
  if (!bVar5) {
    uVar4 = (uint)(!bVar5 && uVar1 != uVar2);
  }
  uVar3 = memcmp(this->data_,b->data_,__n);
  if (uVar3 == 0) {
    uVar3 = uVar4;
  }
  return uVar3;
}

Assistant:

inline int Slice::compare(const Slice &b) const {
        const size_t min_len = (size_ < b.size_) ? size_ : b.size_;
        int r = memcmp(data_, b.data_, min_len);
        if (r == 0) {
            if (size_ < b.size_) r = -1;
            else if (size_ > b.size_) r = +1;
        }
        return r;
    }